

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::AddExtensionGenerators
          (MessageGenerator *this,
          vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
          *extension_generators)

{
  bool bVar1;
  int index;
  FieldDescriptor *extension;
  _Alloc_hider local_40;
  _Alloc_hider local_38;
  
  for (index = 0; index < *(int *)(this->descriptor_ + 0x8c); index = index + 1) {
    local_38._M_p = (pointer)Descriptor::extension(this->descriptor_,index);
    if ((this->generation_options_->strip_custom_options != true) ||
       (bVar1 = ExtensionIsCustomOption((FieldDescriptor *)local_38._M_p), !bVar1)) {
      std::
      make_unique<google::protobuf::compiler::objectivec::ExtensionGenerator,std::__cxx11::string_const&,google::protobuf::FieldDescriptor_const*&,google::protobuf::compiler::objectivec::GenerationOptions_const&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40,
                 (FieldDescriptor **)&this->class_name_,
                 (GenerationOptions *)&stack0xffffffffffffffc8);
      std::
      vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>>>>
      ::
      emplace_back<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>>>
                ((vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>>>>
                  *)extension_generators,
                 (unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
                  *)&local_40);
      std::
      unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
      ::~unique_ptr((unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
                     *)&local_40);
      local_40._M_p =
           (pointer)(extension_generators->
                    super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                    super___uniq_ptr_impl<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
                    .
                    super__Head_base<0UL,_google::protobuf::compiler::objectivec::ExtensionGenerator_*,_false>
                    ._M_head_impl;
      std::
      vector<google::protobuf::compiler::objectivec::ExtensionGenerator_const*,std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_const*>>
      ::emplace_back<google::protobuf::compiler::objectivec::ExtensionGenerator_const*>
                ((vector<google::protobuf::compiler::objectivec::ExtensionGenerator_const*,std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_const*>>
                  *)&this->extension_generators_,(ExtensionGenerator **)&local_40);
    }
  }
  return;
}

Assistant:

void MessageGenerator::AddExtensionGenerators(
    std::vector<std::unique_ptr<ExtensionGenerator>>* extension_generators) {
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    const FieldDescriptor* extension = descriptor_->extension(i);
    if (!generation_options_.strip_custom_options ||
        !ExtensionIsCustomOption(extension)) {
      extension_generators->push_back(std::make_unique<ExtensionGenerator>(
          class_name_, extension, generation_options_));
      extension_generators_.push_back(extension_generators->back().get());
    }
  }
}